

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O1

bool HDRLoader::load(char *fileName,HDRLoaderResult *res)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  uchar *puVar5;
  char cVar6;
  ulong uVar7;
  uchar *scanline;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  float *pfVar11;
  bool bVar12;
  double dVar13;
  int w;
  int h;
  char reso [200];
  char str [200];
  uint local_20c;
  ulong local_208;
  float *local_200;
  undefined4 local_1f8;
  uint local_1f4;
  uchar *local_1f0;
  ulong local_1e8;
  RGBE *local_1e0;
  uchar *local_1d8;
  long local_1d0;
  char local_1c8 [208];
  long local_f8;
  short local_f0;
  
  __stream = fopen(fileName,"rb");
  if (__stream != (FILE *)0x0) {
    fread(&local_f8,10,1,__stream);
    if (local_f0 == 0x4543 && local_f8 == 0x4e41494441523f23) {
      fseek(__stream,1,1);
      iVar3 = 0;
      do {
        iVar2 = fgetc(__stream);
        cVar6 = (char)iVar3;
        iVar3 = iVar2;
      } while (cVar6 != '\n' || (char)iVar2 != '\n');
      pcVar9 = local_1c8;
      do {
        iVar3 = fgetc(__stream);
        *pcVar9 = (char)iVar3;
        pcVar9 = pcVar9 + 1;
      } while ((char)iVar3 != '\n');
      iVar3 = __isoc99_sscanf(local_1c8,"-Y %d +X %d",&local_1f4,&local_20c);
      uVar1 = CONCAT31((int3)((uint)iVar2 >> 8),iVar3 != 0);
      if (iVar3 != 0) {
        lVar10 = (long)(int)local_20c;
        res->width = local_20c;
        res->height = local_1f4;
        uVar7 = (long)(int)(local_1f4 * local_20c * 3) << 2;
        if ((int)(local_1f4 * local_20c) < 0) {
          uVar7 = 0xffffffffffffffff;
        }
        local_1f8 = uVar1;
        local_200 = (float *)operator_new__(uVar7);
        uVar7 = lVar10 * 4;
        res->cols = local_200;
        if (lVar10 < 0) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (uchar *)operator_new__(uVar7);
        local_1e8 = (ulong)local_1f4;
        if (0 < (int)local_1f4) {
          local_1d8 = puVar5 + 3;
          local_1e0 = (RGBE *)(puVar5 + 4);
          local_1f0 = puVar5;
          do {
            puVar5 = local_1f0;
            uVar4 = local_20c;
            uVar7 = (ulong)local_20c;
            scanline = puVar5;
            if (local_20c - 0x8000 < 0xffff8008) {
LAB_001c8931:
              bVar12 = oldDecrunch((RGBE *)scanline,uVar4,(FILE *)__stream);
            }
            else {
              iVar3 = fgetc(__stream);
              if (iVar3 != 2) {
                fseek(__stream,-1,1);
                goto LAB_001c8931;
              }
              iVar3 = fgetc(__stream);
              puVar5[1] = (uchar)iVar3;
              iVar3 = fgetc(__stream);
              puVar5[2] = (uchar)iVar3;
              iVar3 = fgetc(__stream);
              if ((puVar5[1] != '\x02') || ((char)puVar5[2] < '\0')) {
                *puVar5 = '\x02';
                puVar5[3] = (char)iVar3;
                uVar4 = uVar4 - 1;
                scanline = *local_1e0;
                goto LAB_001c8931;
              }
              lVar10 = 0;
              local_208 = uVar7;
              do {
                local_1d0 = lVar10;
                if (0 < (int)uVar7) {
                  iVar3 = 0;
                  do {
                    uVar4 = fgetc(__stream);
                    bVar8 = (byte)uVar4;
                    if ((uVar4 & 0xff) < 0x81) {
                      if (bVar8 != 0) {
                        lVar10 = 0;
                        do {
                          iVar2 = fgetc(__stream);
                          puVar5[lVar10 * 4 + (long)iVar3 * 4] = (char)iVar2;
                          lVar10 = lVar10 + 1;
                        } while (bVar8 != (byte)lVar10);
                        iVar3 = iVar3 + (int)lVar10;
                        uVar7 = local_208;
                      }
                    }
                    else {
                      iVar2 = fgetc(__stream);
                      if ((uVar4 & 0x7f) != 0) {
                        lVar10 = 0;
                        do {
                          puVar5[lVar10 * 4 + (long)iVar3 * 4] = (char)iVar2;
                          lVar10 = lVar10 + 1;
                        } while ((bVar8 & 0x7f) != (byte)lVar10);
                        iVar3 = iVar3 + (int)lVar10;
                      }
                    }
                  } while (iVar3 < (int)uVar7);
                }
                lVar10 = local_1d0 + 1;
                puVar5 = puVar5 + 1;
              } while (lVar10 != 4);
              iVar3 = feof(__stream);
              bVar12 = iVar3 == 0;
              puVar5 = local_1f0;
            }
            if (bVar12 == false) break;
            if (0 < (int)local_20c) {
              iVar3 = local_20c + 1;
              puVar5 = local_1d8;
              pfVar11 = local_200;
              do {
                iVar2 = *puVar5 - 0x80;
                local_208._0_4_ = (float)(*(RGBE *)(puVar5 + -3))[0] * 0.00390625;
                dVar13 = ldexp(1.0,iVar2);
                *pfVar11 = (float)dVar13 * (float)local_208;
                local_208._0_4_ = (float)puVar5[-2] * 0.00390625;
                dVar13 = ldexp(1.0,iVar2);
                pfVar11[1] = (float)dVar13 * (float)local_208;
                local_208 = CONCAT44(local_208._4_4_,(float)puVar5[-1] * 0.00390625);
                dVar13 = ldexp(1.0,iVar2);
                pfVar11[2] = (float)dVar13 * (float)local_208;
                pfVar11 = pfVar11 + 3;
                puVar5 = puVar5 + 4;
                iVar3 = iVar3 + -1;
              } while (1 < iVar3);
            }
            iVar3 = (int)local_1e8;
            local_1e8 = (ulong)(iVar3 - 1);
            local_200 = local_200 + (long)(int)local_20c * 3;
            puVar5 = local_1f0;
          } while (1 < iVar3);
        }
        operator_delete__(puVar5);
        uVar1 = local_1f8;
      }
      fclose(__stream);
      return (bool)(char)uVar1;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

bool HDRLoader::load(const char *fileName, HDRLoaderResult &res)
{
	int i;
	char str[200];
	FILE *file;

	file = fopen(fileName, "rb");
	if (!file)
		return false;

	fread(str, 10, 1, file);
	if (memcmp(str, "#?RADIANCE", 10)) {
		fclose(file);
		return false;
	}

	fseek(file, 1, SEEK_CUR);

	char cmd[200];
	i = 0;
	char c = 0, oldc;
	while(true) {
		oldc = c;
		c = fgetc(file);
		if (c == 0xa && oldc == 0xa)
			break;
		cmd[i++] = c;
	}

	char reso[200];
	i = 0;
	while(true) {
		c = fgetc(file);
		reso[i++] = c;
		if (c == 0xa)
			break;
	}

	int w, h;
	if (!sscanf(reso, "-Y %d +X %d", &h, &w)) {
		fclose(file);
		return false;
	}

	res.width = w;
	res.height = h;

	float *cols = new float[w * h * 3];
	res.cols = cols;

	RGBE *scanline = new RGBE[w];
	if (!scanline) {
		fclose(file);
		return false;
	}

	// convert image 
	for (int y = h - 1; y >= 0; y--) {
		if (decrunch(scanline, w, file) == false)
			break;
		workOnRGBE(scanline, w, cols);
		cols += w * 3;
	}

	delete [] scanline;
	fclose(file);

	return true;
}